

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.c
# Opt level: O0

void assert_parse_number(char *string,int integer,double real)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  double real_local;
  int integer_local;
  char *string_local;
  parse_buffer buffer;
  
  buffer.hooks.reallocate = *(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28);
  memset(&string_local,0,0x38);
  string_local = string;
  sVar2 = strlen(string);
  buffer.content = (uchar *)(sVar2 + 1);
  cVar1 = parse_number(item,(parse_buffer *)&string_local);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x34);
  }
  assert_is_number(item);
  UnityAssertEqualNumber((long)integer,(long)item[0].valueint,0,0x36,0x14);
  UnityAssertDoublesWithin(real * 1e-12,real,item[0].valuedouble,0,0x37);
  if (*(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28) != buffer.hooks.reallocate) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_parse_number(const char *string, int integer, double real)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = (const unsigned char*)string;
    buffer.length = strlen(string) + sizeof("");

    TEST_ASSERT_TRUE(parse_number(item, &buffer));
    assert_is_number(item);
    TEST_ASSERT_EQUAL_INT(integer, item->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(real, item->valuedouble);
}